

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O2

bool __thiscall xercesc_4_0::XMLReader::getNCName(XMLReader *this,XMLBuffer *toFill)

{
  XMLCh XVar1;
  bool bVar2;
  ulong uVar3;
  XMLSize_t XVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar6 = this->fCharIndex;
  if (uVar6 == this->fCharsAvail) {
    bVar2 = refreshCharBuffer(this);
    if (bVar2) {
      uVar6 = this->fCharIndex;
      goto LAB_002bf40d;
    }
LAB_002bf456:
    bVar2 = false;
  }
  else {
LAB_002bf40d:
    XVar1 = this->fCharBuf[uVar6];
    if ((ushort)(XVar1 + L'⠀') < 0x380) {
      XVar4 = uVar6 + 1;
      if (XVar4 == this->fCharsAvail) {
        bVar2 = refreshCharBuffer(this);
        if (!bVar2) goto LAB_002bf456;
        uVar6 = this->fCharIndex;
        XVar4 = uVar6 + 1;
      }
      if ((ushort)(this->fCharBuf[XVar4] + L'\x2000') < 0xfc00) goto LAB_002bf456;
      uVar3 = uVar6 + 2;
    }
    else {
      if ((ulong)(ushort)XVar1 == 0x3a) {
        return false;
      }
      if ((this->fgCharCharsTable[(ushort)XVar1] & 2) == 0) {
        return false;
      }
      uVar3 = uVar6 + 1;
    }
    this->fCharIndex = uVar3;
    uVar5 = this->fCharsAvail;
    do {
      bVar2 = uVar3 == uVar5;
      uVar5 = uVar3;
      if (bVar2) {
        XVar4 = uVar3 - uVar6;
        if (XVar4 != 0) {
          this->fCurCol = this->fCurCol + XVar4;
          XMLBuffer::append(toFill,this->fCharBuf + uVar6,XVar4);
        }
        bVar2 = refreshCharBuffer(this);
        if (!bVar2) {
          return true;
        }
        uVar5 = this->fCharIndex;
        uVar6 = uVar5;
      }
      while (uVar5 < this->fCharsAvail) {
        if ((ushort)(this->fCharBuf[uVar5] + L'⠀') < 0x380) {
          uVar3 = uVar5 + 1;
          if (uVar3 == this->fCharsAvail) {
            XVar4 = uVar5 - uVar6;
            if (XVar4 != 0) {
              this->fCurCol = this->fCurCol + XVar4;
              XMLBuffer::append(toFill,this->fCharBuf + uVar6,XVar4);
            }
            bVar2 = refreshCharBuffer(this);
            uVar5 = this->fCharIndex;
            if (!bVar2) break;
            uVar3 = uVar5 + 1;
            uVar6 = uVar5;
          }
          if ((ushort)(this->fCharBuf[uVar3] + L'\x2000') < 0xfc00) break;
          uVar5 = uVar5 + 2;
        }
        else {
          if ((this->fgCharCharsTable[(ushort)this->fCharBuf[uVar5]] & 1) == 0) break;
          uVar5 = uVar5 + 1;
        }
        this->fCharIndex = uVar5;
      }
      uVar3 = uVar5;
    } while (uVar5 == this->fCharsAvail);
    bVar2 = true;
    XVar4 = uVar5 - uVar6;
    if (XVar4 != 0) {
      this->fCurCol = this->fCurCol + XVar4;
      XMLBuffer::append(toFill,this->fCharBuf + uVar6,XVar4);
    }
  }
  return bVar2;
}

Assistant:

bool XMLReader::getNCName(XMLBuffer& toFill)
{
    if (fCharIndex == fCharsAvail && !refreshCharBuffer())
        return false;

    XMLSize_t charIndex_start = fCharIndex, count;
    //  Lets check the first char for being a first name char. If not, then
    //  what's the point in living mannnn? Just give up now. We only do this
    //  if its a name and not a name token that they want.
    if ((fCharBuf[fCharIndex] >= 0xD800) && (fCharBuf[fCharIndex] <= 0xDB7F)) {
        // if there isn't one more char in the buffer, read more data
        if (fCharIndex+1 == fCharsAvail)
        {
            if (!refreshCharBuffer())
                return false;
            // reset the start buffer to the new location of the cursor
            charIndex_start = fCharIndex;
        }
        if ((fCharBuf[fCharIndex+1] < 0xDC00) || (fCharBuf[fCharIndex+1] > 0xDFFF))
            return false;

        // Looks ok, so lets eat it
        fCharIndex += 2;
    }
    else {
        if (!isFirstNCNameChar(fCharBuf[fCharIndex])) {
            return false;
        }

        // Looks ok, so lets eat it
        fCharIndex++;
    }

    do
    {
        if (fCharIndex == fCharsAvail)
        {
            // we have to copy the accepted character(s), and update the column number,
            // before getting new data and losing the value of fCharIndex
            if((count = fCharIndex - charIndex_start)!=0)
            {
                fCurCol += (XMLFileLoc)count;
                toFill.append(&fCharBuf[charIndex_start], count);
            }
            if(!refreshCharBuffer())
                return true;
            charIndex_start = fCharIndex;
        }

        //  Check the current char and take it if it's a name char
        while(fCharIndex < fCharsAvail)
        {
            if((fCharBuf[fCharIndex] >= 0xD800) && (fCharBuf[fCharIndex] <= 0xDB7F))
            {
                // if there isn't one more char in the buffer, read more data
                if (fCharIndex+1 == fCharsAvail)
                {
                    // but first copy the accepted character(s), and update column
                    if (fCharIndex != charIndex_start)
                    {
                        fCurCol += (XMLFileLoc)(fCharIndex - charIndex_start);
                        toFill.append(&fCharBuf[charIndex_start], fCharIndex - charIndex_start);
                    }

                    if (!refreshCharBuffer())
                        break;

                    charIndex_start = fCharIndex;
                }
                if ( (fCharBuf[fCharIndex+1] < 0xDC00) ||
                    (fCharBuf[fCharIndex+1] > 0xDFFF)  )
                    break;
                fCharIndex += 2;
            }
            else if(isNCNameChar(fCharBuf[fCharIndex])) fCharIndex++;
            else break;
        }
        // if we didn't consume the entire buffer, we are done
    } while(fCharIndex == fCharsAvail);

    // we have to copy the accepted character(s), and update column
    if((count = fCharIndex - charIndex_start)!=0)
    {
        fCurCol += (XMLFileLoc)count;
        toFill.append(&fCharBuf[charIndex_start], count);
    }
    return true;
}